

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.hpp
# Opt level: O2

conflicting_param * __thiscall
boost::runtime::specific_param_error<boost::runtime::conflicting_param,boost::runtime::init_error>::
operator<<(conflicting_param *__return_storage_ptr__,
          specific_param_error<boost::runtime::conflicting_param,boost::runtime::init_error> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val)

{
  string local_40;
  
  unit_test::utils::string_cast<std::__cxx11::string>(&local_40,(utils *)val,val);
  std::__cxx11::string::append((string *)(this + 0x18));
  std::__cxx11::string::~string((string *)&local_40);
  conflicting_param::conflicting_param(__return_storage_ptr__,(conflicting_param *)this);
  return __return_storage_ptr__;
}

Assistant:

Derived operator<<(T const& val) &&
    {
        this->msg.append( unit_test::utils::string_cast( val ) );

        return reinterpret_cast<Derived&&>(*this);
    }